

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

sigrenderer_t * it_start_sigrenderer(DUH *duh,sigdata_t *vsigdata,int n_channels,int32 pos)

{
  long *plVar1;
  int iVar2;
  IT_CALLBACKS *callbacks;
  long *plVar3;
  DUMB_IT_SIGRENDERER *sigrenderer;
  DUMB_CLICK_REMOVER **ppDVar4;
  
  callbacks = (IT_CALLBACKS *)malloc(0x40);
  if (callbacks != (IT_CALLBACKS *)0x0) {
    callbacks->loop = (_func_int_void_ptr *)0x0;
    callbacks->xm_speed_zero = (_func_int_void_ptr *)0x0;
    callbacks->midi = (_func_int_void_ptr_int_uchar *)0x0;
    callbacks->global_volume_zero = (_func_int_void_ptr *)0x0;
    plVar1 = *(long **)((long)vsigdata + 0x130);
    if (*(long **)((long)vsigdata + 0x130) == (long *)0x0) {
      ppDVar4 = dumb_create_click_remover_array(n_channels);
      sigrenderer = init_sigrenderer((DUMB_IT_SIGDATA *)vsigdata,n_channels,0,callbacks,ppDVar4);
      if (sigrenderer == (DUMB_IT_SIGRENDERER *)0x0) {
        return (sigrenderer_t *)0x0;
      }
    }
    else {
      do {
        plVar3 = plVar1;
        plVar1 = (long *)*plVar3;
        if (plVar1 == (long *)0x0) break;
      } while (*(int *)(plVar1 + 1) < pos);
      sigrenderer = dup_sigrenderer((DUMB_IT_SIGRENDERER *)plVar3[2],n_channels,callbacks);
      if (sigrenderer == (DUMB_IT_SIGRENDERER *)0x0) {
        return (sigrenderer_t *)0x0;
      }
      ppDVar4 = dumb_create_click_remover_array(n_channels);
      sigrenderer->click_remover = ppDVar4;
      pos = pos - (int)plVar3[1];
    }
    do {
      if ((pos < 1) || (pos < sigrenderer->time_left)) {
        render(sigrenderer,0.0,1.0,0,pos,(sample_t_conflict **)0x0);
        sigrenderer->time_left = sigrenderer->time_left - pos;
        return sigrenderer;
      }
      render(sigrenderer,0.0,1.0,0,sigrenderer->time_left,(sample_t_conflict **)0x0);
      pos = pos - sigrenderer->time_left;
      sigrenderer->time_left = 0;
      iVar2 = process_tick(sigrenderer);
    } while (iVar2 == 0);
    _dumb_it_end_sigrenderer(sigrenderer);
  }
  return (sigrenderer_t *)0x0;
}

Assistant:

static sigrenderer_t *it_start_sigrenderer(DUH *duh, sigdata_t *vsigdata, int n_channels, int32 pos)
{
	DUMB_IT_SIGDATA *sigdata = vsigdata;
	DUMB_IT_SIGRENDERER *sigrenderer;

	(void)duh;

	{
		IT_CALLBACKS *callbacks = create_callbacks();
		if (!callbacks) return NULL;

		if (sigdata->checkpoint) {
			IT_CHECKPOINT *checkpoint = sigdata->checkpoint;
			while (checkpoint->next && checkpoint->next->time < pos)
				checkpoint = checkpoint->next;
			sigrenderer = dup_sigrenderer(checkpoint->sigrenderer, n_channels, callbacks);
			if (!sigrenderer) return NULL;
			sigrenderer->click_remover = dumb_create_click_remover_array(n_channels);
			pos -= checkpoint->time;
		} else {
			sigrenderer = init_sigrenderer(sigdata, n_channels, 0, callbacks,
				dumb_create_click_remover_array(n_channels));
			if (!sigrenderer) return NULL;
		}
	}

	while (pos > 0 && pos >= sigrenderer->time_left) {
		render(sigrenderer, 0, 1.0f, 0, sigrenderer->time_left, NULL);

		pos -= sigrenderer->time_left;
		sigrenderer->time_left = 0;

		if (process_tick(sigrenderer)) {
			_dumb_it_end_sigrenderer(sigrenderer);
			return NULL;
		}
	}

	render(sigrenderer, 0, 1.0f, 0, pos, NULL);
	sigrenderer->time_left -= pos;

	return sigrenderer;
}